

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O3

string * __thiscall
t_rb_generator::full_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_rb_generator *this,t_type *ttype)

{
  pointer pcVar1;
  long lVar2;
  string *psVar3;
  long *plVar4;
  size_type *psVar5;
  pointer pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modules;
  undefined1 local_98 [32];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string *local_58;
  t_type *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_78[0] = local_68;
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"::","");
  local_50 = ttype;
  ruby_modules_abi_cxx11_(&local_48,this,ttype->program_);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar6 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      local_98._0_8_ = (t_rb_generator *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + pbVar6->_M_string_length);
      std::__cxx11::string::append(local_98);
      this = (t_rb_generator *)local_98._0_8_;
      std::__cxx11::string::_M_append((char *)local_78,local_98._0_8_);
      if ((t_rb_generator *)local_98._0_8_ != (t_rb_generator *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  type_name_abi_cxx11_((string *)local_98,this,local_50);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,(ulong)local_78[0]);
  psVar3 = local_58;
  (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar2 = plVar4[3];
    (local_58->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&local_58->field_2 + 8) = lVar2;
  }
  else {
    (local_58->_M_dataplus)._M_p = (pointer)*plVar4;
    (local_58->field_2)._M_allocated_capacity = *psVar5;
  }
  local_58->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((t_rb_generator *)local_98._0_8_ != (t_rb_generator *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  return psVar3;
}

Assistant:

string t_rb_generator::full_type_name(const t_type* ttype) {
  string prefix = "::";
  vector<std::string> modules = ruby_modules(ttype->get_program());
  for (auto & module : modules) {
    prefix += module + "::";
  }
  return prefix + type_name(ttype);
}